

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Connector.cpp
# Opt level: O2

void __thiscall sznet::net::Connector::handleError(Connector *this)

{
  sz_sock sockfd;
  int v;
  self *psVar1;
  LogStream *this_00;
  char *str;
  SourceFile file;
  SourceFile file_00;
  Logger local_1018;
  undefined1 local_48 [12];
  undefined1 local_38 [12];
  
  Logger::SourceFile::SourceFile<100>
            ((SourceFile *)local_48,
             (char (*) [100])
             "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/Connector.cpp"
            );
  file._12_4_ = 0;
  file.m_data = (char *)local_48._0_8_;
  file.m_size = local_48._8_4_;
  Logger::Logger(&local_1018,file,0xcc,ERROR);
  psVar1 = LogStream::operator<<(&local_1018.m_impl.m_stream,"Connector::handleError state=");
  LogStream::operator<<(psVar1,this->m_state);
  Logger::~Logger(&local_1018);
  if (this->m_state == kConnecting) {
    sockfd = removeAndResetChannel(this);
    v = sockets::sz_sock_geterror(sockfd);
    if (g_logLevel < 1) {
      Logger::SourceFile::SourceFile<100>
                ((SourceFile *)local_38,
                 (char (*) [100])
                 "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/Connector.cpp"
                );
      file_00._12_4_ = 0;
      file_00.m_data = (char *)local_38._0_8_;
      file_00.m_size = local_38._8_4_;
      Logger::Logger(&local_1018,file_00,0xd1,TRACE,"handleError");
      psVar1 = LogStream::operator<<(&local_1018.m_impl.m_stream,"SO_ERROR = ");
      this_00 = LogStream::operator<<(psVar1,v);
      psVar1 = LogStream::operator<<(this_00," ");
      str = sz_strerror_tl(v);
      LogStream::operator<<(psVar1,str);
      Logger::~Logger(&local_1018);
    }
    retry(this,sockfd);
  }
  return;
}

Assistant:

void Connector::handleError()
{
	LOG_ERROR << "Connector::handleError state=" << m_state;
	if (m_state == kConnecting)
	{
		sockets::sz_sock sockfd = removeAndResetChannel();
		int err = sockets::sz_sock_geterror(sockfd);
		LOG_TRACE << "SO_ERROR = " << err << " " << sz_strerror_tl(err);
		retry(sockfd);
	}
}